

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
::
Boundary_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
           *this,vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings)

{
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *nonZeroRowIndices;
  pointer pvVar1;
  pointer ppVar2;
  pointer ppVar3;
  node_ptr plVar4;
  uint dimension;
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
  *this_00;
  long lVar5;
  ulong uVar6;
  pointer pvVar7;
  ulong uVar8;
  Index columnIndex;
  node_ptr plVar9;
  undefined1 auVar10 [16];
  double dVar11;
  Index local_8c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
  *local_80;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  *local_78;
  Delete_disposer local_70;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  local_68;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined4 *)(this + 0x18) = 0xffffffff;
  pvVar7 = (orderedBoundaries->
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (orderedBoundaries->
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
             *)operator_new(0x18);
  (this_00->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
    **)(this + 0x20) = this_00;
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
  ::resize(this_00,(ulong)(uint)((int)((ulong)((long)pvVar1 - (long)pvVar7) >> 3) * -0x55555555));
  *(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
    **)(this + 0x28) = this + 0x58;
  *(undefined8 *)(this + 0x30) = 1;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined4 *)(this + 0x48) = 0x3f800000;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  local_88 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(this + 0x28);
  lVar5 = ((long)(orderedBoundaries->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(orderedBoundaries->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  *(int *)(this + 0x60) = (int)lVar5;
  auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar10._0_8_ = lVar5;
  auVar10._12_4_ = 0x45300000;
  *(Column_settings **)(this + 0x68) = colSettings;
  dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  uVar6 = (ulong)dVar11;
  local_80 = this + 0x20;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(local_88,(long)(dVar11 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
  pvVar7 = (orderedBoundaries->
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((orderedBoundaries->
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
    uVar6 = 0;
    local_78 = orderedBoundaries;
    do {
      nonZeroRowIndices = pvVar7 + uVar6;
      ppVar2 = (nonZeroRowIndices->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (nonZeroRowIndices->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dimension = (int)((ulong)((long)ppVar2 - (long)ppVar3) >> 3) - 1;
      if (ppVar2 == ppVar3) {
        dimension = 0;
      }
      columnIndex = (Index)uVar6;
      local_8c = columnIndex;
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
      ::
      Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>>>>>
                ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
                  *)&local_68,columnIndex,nonZeroRowIndices,dimension,
                 *(vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>
                   **)(this + 0x20),*(Column_settings **)(this + 0x68));
      std::__detail::
      _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
                ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_88,(const_iterator)0x0,&local_8c,&local_68);
      plVar9 = local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
      local_70.col_ = &local_68;
      while (plVar9 != (node_ptr)&local_68.column_) {
        plVar4 = plVar9->next_;
        plVar9->next_ = (node_ptr)0x0;
        plVar9->prev_ = (node_ptr)0x0;
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        ::Delete_disposer::operator()(&local_70,(Entry *)&plVar9[-1].prev_);
        plVar9 = plVar4;
      }
      local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
      local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
      Matrix_all_dimension_holder<int>::update_up
                ((Matrix_all_dimension_holder<int> *)this,dimension);
      uVar6 = (ulong)(columnIndex + 1);
      pvVar7 = (local_78->
               super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(local_78->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
              -0x5555555555555555;
    } while (uVar6 <= uVar8 && uVar8 - uVar6 != 0);
  }
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                                       Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Swap_opt(orderedBoundaries.size()),
      Pair_opt(),
      RA_opt(orderedBoundaries.size()),
      nextInsertIndex_(orderedBoundaries.size()),
      colSettings_(colSettings)
{
  matrix_.reserve(orderedBoundaries.size());

  for (Index i = 0; i < orderedBoundaries.size(); i++) {
    _container_insert(orderedBoundaries[i], i, orderedBoundaries[i].size() == 0 ? 0 : orderedBoundaries[i].size() - 1);
  }
}